

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

int __thiscall Ym_Emu<Ym2413_Emu>::run_until(Ym_Emu<Ym2413_Emu> *this,int time)

{
  OPLL *pOVar1;
  int iVar2;
  int in_ESI;
  Ym2413_Emu *in_RDI;
  short *p;
  int count;
  
  iVar2 = in_ESI - *(int *)&in_RDI[1].opll;
  if (0 < iVar2) {
    if (*(int *)&in_RDI[1].opll < 0) {
      return 0;
    }
    *(int *)&in_RDI[1].opll = in_ESI;
    pOVar1 = in_RDI[2].opll;
    in_RDI[2].opll = in_RDI[2].opll + (long)(iVar2 * 2) * 2;
    Ym2413_Emu::run(in_RDI,iVar2,(sample_t_conflict1 *)pOVar1);
  }
  return 1;
}

Assistant:

inline int Ym_Emu<Emu>::run_until( int time )
{
	int count = time - last_time;
	if ( count > 0 )
	{
		if ( last_time < 0 )
			return false;
		last_time = time;
		short* p = out;
		out += count * Emu::out_chan_count;
		Emu::run( count, p );
	}
	return true;
}